

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_playback(Pager *pPager,int isHot)

{
  i64 *pOffset;
  int iVar1;
  sqlite3_vfs *psVar2;
  ulong uVar3;
  char *pcVar4;
  u32 uVar5;
  u32 uVar6;
  undefined1 *puVar7;
  int iVar8;
  int iVar9;
  sqlite3_file *p;
  undefined4 *p_00;
  sqlite3_file *pJrnl;
  char *zSuper;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  char *__s;
  sqlite3_vfs *pVfs;
  char *pcVar13;
  uint uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  u32 savedPageSize;
  int res;
  Pgno mxPg;
  i64 szJ;
  int local_a0;
  u32 local_60;
  int local_5c;
  u32 local_58;
  u32 local_54;
  undefined1 *local_50;
  int local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = pPager->pVfs;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0;
  local_5c = 1;
  local_60 = (u32)pPager->pageSize;
  iVar8 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&local_50);
  uVar14 = 0;
  if (iVar8 == 0) {
    pcVar13 = pPager->pTmpSpace;
    iVar8 = readSuperJournal(pPager->jfd,pcVar13,pPager->pVfs->mxPathname + 1);
    if (iVar8 == 0) {
      iVar8 = 0;
      if (*pcVar13 != '\0') {
        iVar8 = (*psVar2->xAccess)(psVar2,pcVar13,0,&local_5c);
      }
      uVar14 = 0;
      if ((iVar8 == 0) && (uVar14 = 0, local_5c != 0)) {
        local_54 = 0xaaaaaaaa;
        pOffset = &pPager->journalOff;
        pPager->journalOff = 0;
        uVar14 = 0;
        local_a0 = isHot;
LAB_0013a60f:
        iVar8 = readJournalHdr(pPager,isHot,(i64)local_50,&local_54,&local_58);
        uVar5 = local_58;
        if (iVar8 == 0) {
          uVar11 = (ulong)pPager->sectorSize;
          if (local_54 == 0xffffffff) {
            local_54 = (u32)((long)((long)local_50 - uVar11) / (pPager->pageSize + 8));
          }
          uVar3 = *pOffset;
          if ((local_54 == 0 && isHot == 0) && (pPager->journalHdr + uVar11 == uVar3)) {
            local_54 = (u32)((long)((long)local_50 - uVar3) / (pPager->pageSize + 8));
          }
          uVar6 = local_54;
          if (uVar3 == uVar11) {
            iVar8 = pager_truncate(pPager,local_58);
            if (iVar8 != 0) goto LAB_0013a55a;
            pPager->dbSize = uVar5;
            if (pPager->mxPgno < uVar5) {
              pPager->mxPgno = uVar5;
            }
          }
          if (uVar6 != 0) {
            bVar15 = local_a0 == 0;
            iVar12 = 0;
            do {
              if (!bVar15) {
                pager_reset(pPager);
              }
              iVar8 = pager_playback_one_page(pPager,pOffset,(Bitvec *)0x0,1,0);
              if (iVar8 != 0) {
                if (iVar8 != 0x65) {
                  uVar14 = uVar14 - iVar12;
                  if (iVar8 != 0x20a) goto LAB_0013a75f;
                  goto LAB_0013a768;
                }
                *pOffset = (i64)local_50;
                uVar14 = uVar14 - iVar12;
                local_a0 = 0;
                goto LAB_0013a60f;
              }
              iVar12 = iVar12 + -1;
              bVar15 = true;
            } while (-uVar6 != iVar12);
            local_a0 = 0;
            uVar14 = uVar14 + uVar6;
          }
          goto LAB_0013a60f;
        }
        if (iVar8 == 0x65) goto LAB_0013a768;
      }
      else {
LAB_0013a75f:
        if (iVar8 == 0) {
LAB_0013a768:
          iVar8 = sqlite3PagerSetPagesize(pPager,&local_60,-1);
          pPager->changeCountDone = pPager->tempFile;
          if (iVar8 != 0) goto LAB_0013a560;
          pcVar13 = pPager->pTmpSpace + 4;
          iVar8 = readSuperJournal(pPager->jfd,pcVar13,pPager->pVfs->mxPathname + 1);
          if ((iVar8 != 0) ||
             (((byte)(pPager->eState - 4) < 0xfd &&
              (iVar8 = sqlite3PagerSync(pPager,(char *)0x0), iVar8 != 0)))) goto LAB_0013a560;
          iVar8 = pager_end_transaction(pPager,(uint)(*pcVar13 != '\0'),0);
          if ((iVar8 != 0) || ((iVar8 = 0, *pcVar13 == '\0' || (local_5c == 0)))) goto LAB_0013a560;
          pcVar4 = pPager->pTmpSpace;
          pcVar4[0] = '\0';
          pcVar4[1] = '\0';
          pcVar4[2] = '\0';
          pcVar4[3] = '\0';
          psVar2 = pPager->pVfs;
          p = (sqlite3_file *)sqlite3MallocZero((long)psVar2->szOsFile * 2);
          if (p == (sqlite3_file *)0x0) {
            iVar8 = 7;
            goto LAB_0013a560;
          }
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          iVar8 = (*psVar2->xOpen)(psVar2,pcVar13,p,0x4001,(int *)0x0);
          if (iVar8 == 0) {
            iVar12 = psVar2->szOsFile;
            iVar8 = (*p->pMethods->xFileSize)(p,(sqlite3_int64 *)&local_40);
            if (iVar8 == 0) {
              iVar1 = psVar2->mxPathname;
              p_00 = (undefined4 *)sqlite3Malloc((u64)(local_40 + (long)iVar1 + 7));
              puVar7 = local_40;
              if (p_00 != (undefined4 *)0x0) {
                pcVar4 = (char *)(p_00 + 1);
                *p_00 = 0;
                iVar8 = (*p->pMethods->xRead)(p,pcVar4,(int)local_40,0);
                if (iVar8 == 0) {
                  pcVar4[(long)local_40] = '\0';
                  *(undefined1 *)((long)p_00 + (long)(local_40 + 5)) = 0;
                  if (0 < (long)local_40) {
                    pJrnl = (sqlite3_file *)((long)&p->pMethods + (long)iVar12);
                    zSuper = (char *)((long)p_00 + (long)(puVar7 + 6));
                    __s = pcVar4;
                    do {
                      local_44 = -0x55555556;
                      iVar12 = (*psVar2->xAccess)(psVar2,__s,0,&local_44);
                      iVar8 = iVar12;
                      if (iVar12 != 0) {
LAB_0013aaac:
                        sqlite3_free(p_00);
                        goto LAB_0013a90a;
                      }
                      if (local_44 != 0) {
                        iVar8 = (*psVar2->xOpen)(psVar2,__s,pJrnl,0x4001,(int *)0x0);
                        if (iVar8 == 0) {
                          iVar8 = readSuperJournal(pJrnl,zSuper,iVar1 + 1);
                          if (pJrnl->pMethods != (sqlite3_io_methods *)0x0) {
                            (*pJrnl->pMethods->xClose)(pJrnl);
                            pJrnl->pMethods = (sqlite3_io_methods *)0x0;
                          }
                          if ((iVar8 == 0) &&
                             ((*zSuper == '\0' ||
                              (iVar9 = strcmp(zSuper,pcVar13), iVar8 = iVar12, iVar9 != 0))))
                          goto LAB_0013aa3c;
                        }
                        goto LAB_0013aaac;
                      }
LAB_0013aa3c:
                      sVar10 = strlen(__s);
                      __s = __s + (ulong)((uint)sVar10 & 0x3fffffff) + 1;
                    } while ((long)__s - (long)pcVar4 < (long)local_40);
                  }
                  if (p->pMethods != (sqlite3_io_methods *)0x0) {
                    (*p->pMethods->xClose)(p);
                    p->pMethods = (sqlite3_io_methods *)0x0;
                  }
                  if (psVar2->xDelete == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                    iVar8 = 0;
                  }
                  else {
                    iVar8 = (*psVar2->xDelete)(psVar2,pcVar13,0);
                  }
                }
                goto LAB_0013a905;
              }
              iVar8 = 7;
            }
            p_00 = (undefined4 *)0x0;
          }
          else {
            p_00 = (undefined4 *)0x0;
          }
LAB_0013a905:
          sqlite3_free(p_00);
LAB_0013a90a:
          if (p->pMethods != (sqlite3_io_methods *)0x0) {
            (*p->pMethods->xClose)(p);
            p->pMethods = (sqlite3_io_methods *)0x0;
          }
          sqlite3_free(p);
          goto LAB_0013a560;
        }
      }
    }
  }
LAB_0013a55a:
  pPager->changeCountDone = pPager->tempFile;
LAB_0013a560:
  if ((isHot != 0) && (uVar14 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar14,pPager->zJournal);
  }
  setSectorSize(pPager);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zSuper = 0;        /* Name of super-journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the super-journal name from the journal, if it is present.
  ** If a super-journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zSuper = pPager->pTmpSpace;
  rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zSuper[0] ){
    rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
  }
  zSuper = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error
  ** occurs.
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
      if( pPager->mxPgno<mxPg ){
        pPager->mxPgno = mxPg;
      }
    }

    /* Copy original pages out of the journal and back into the
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or
  ** malloc error that occurred after the change-counter was updated but
  ** before the transaction was committed, then the change-counter
  ** modification may just have been reverted. If this happens in exclusive
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    /* Leave 4 bytes of space before the super-journal filename in memory.
    ** This is because it may end up being passed to sqlite3OsOpen(), in
    ** which case it requires 4 0x00 bytes in memory immediately before
    ** the filename. */
    zSuper = &pPager->pTmpSpace[4];
    rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zSuper[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zSuper[0] && res ){
    /* If there was a super-journal and this routine will return success,
    ** see if it is possible to delete the super-journal.
    */
    assert( zSuper==&pPager->pTmpSpace[4] );
    memset(pPager->pTmpSpace, 0, 4);
    rc = pager_delsuper(pPager, zSuper);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}